

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_model<std::istream,int,unsigned_long>
               (ExtIsoForest *model,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian,bool lacks_range_penalty
               ,bool lacks_scoring_metric)

{
  bool bVar1;
  undefined4 in_ECX;
  byte diff_endian_00;
  vector<char,_std::allocator<char>_> *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  uint in_R8D;
  byte in_R9B;
  IsoHPlane *unaff_retaddr;
  IsoHPlane *node;
  iterator __end2;
  iterator __begin2;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *__range2;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *tree;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_;
  size_t veclen;
  size_t data_sizets [2];
  double data_doubles [2];
  uint8_t data_en_2;
  uint8_t data_en_1 [4];
  uint8_t data_en [3];
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_stack_ffffffffffffff28;
  reference in_stack_ffffffffffffff48;
  iterator in_stack_ffffffffffffff50;
  __normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_> local_a8;
  reference local_a0;
  reference local_88;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *local_80;
  __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
  local_78 [6];
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_30;
  byte local_23;
  byte local_22;
  byte local_21;
  byte local_20;
  char local_1f;
  byte local_1e;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  vector<char,_std::allocator<char>_> *pvVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  
  diff_endian_00 = (byte)in_ECX & 1;
  local_1a = (byte)in_R8D & 1;
  local_1b = in_R9B & 1;
  if (!interrupt_switch) {
    pvVar2 = in_RDX;
    pvVar3 = in_RSI;
    if ((in_R8D & 1) == 0) {
      read_bytes<unsigned_char>
                ((void *)CONCAT44(in_ECX,in_R8D),(size_t)in_stack_ffffffffffffff28,
                 (istream *)0x66ff99);
      *(uint *)(in_RDI + 0x18) = (uint)local_22;
      *(uint *)(in_RDI + 0x1c) = (uint)local_21;
      *(uint *)(in_RDI + 0x20) = (uint)local_20;
      in_RDI[0x40] = (basic_istream<char,_std::char_traits<char>_>)(local_1f != '\0');
    }
    else {
      read_bytes<unsigned_char>
                ((void *)CONCAT44(in_ECX,in_R8D),(size_t)in_stack_ffffffffffffff28,
                 (istream *)0x66ff44);
      *(uint *)(in_RDI + 0x18) = (uint)local_1e;
      *(uint *)(in_RDI + 0x1c) = (uint)local_1d;
      *(uint *)(in_RDI + 0x20) = (uint)local_1c;
    }
    if ((local_1b & 1) == 0) {
      read_bytes<unsigned_char>
                ((void *)CONCAT44(in_ECX,in_R8D),(size_t)in_stack_ffffffffffffff28,
                 (istream *)0x670020);
      *(uint *)(in_RDI + 0x24) = (uint)local_23;
    }
    else {
      *(undefined4 *)(in_RDI + 0x24) = 0;
    }
    read_bytes<double,double>
              (in_RSI,(size_t)in_RDX,(istream *)CONCAT44(in_ECX,in_R8D),
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff28,false);
    *(undefined8 *)(in_RDI + 0x28) = local_38;
    *(undefined8 *)(in_RDI + 0x30) = local_30;
    read_bytes<unsigned_long,unsigned_long>
              (in_RSI,(size_t)in_RDX,(istream *)CONCAT44(in_ECX,in_R8D),
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff28,false);
    *(undefined8 *)(in_RDI + 0x38) = local_48;
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::resize((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
              *)in_stack_ffffffffffffff50._M_current,(size_type)in_stack_ffffffffffffff48);
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::shrink_to_fit((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     *)0x6700f3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x6700fd);
    local_78[0]._M_current =
         (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
         std::
         vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
         ::begin((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  *)in_stack_ffffffffffffff28);
    local_80 = (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
               std::
               vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ::end((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      *)in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
                               *)CONCAT44(in_ECX,in_R8D),
                              (__normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      local_88 = __gnu_cxx::
                 __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
                 ::operator*(local_78);
      read_bytes<unsigned_long,unsigned_long>
                (in_RSI,(size_t)in_RDX,(istream *)CONCAT44(in_ECX,in_R8D),
                 (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff28,false);
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::resize
                ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                 in_stack_ffffffffffffff50._M_current,(size_type)in_stack_ffffffffffffff48);
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::shrink_to_fit
                ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x67019e);
      local_a0 = local_88;
      local_a8._M_current =
           (IsoHPlane *)
           std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::begin(in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff50 =
           std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::end(in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>
                                 *)CONCAT44(in_ECX,in_R8D),
                                (__normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        in_stack_ffffffffffffff48 =
             __gnu_cxx::
             __normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>::
             operator*(&local_a8);
        deserialize_node<std::istream,int,unsigned_long>
                  (unaff_retaddr,in_RDI,pvVar3,pvVar2,(bool)diff_endian_00);
        __gnu_cxx::
        __normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>::
        operator++(&local_a8);
      }
      __gnu_cxx::
      __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
      ::operator++(local_78);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RSI);
  }
  return;
}

Assistant:

void deserialize_model(ExtIsoForest &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    if (lacks_range_penalty)
    {
        uint8_t data_en[3];
        read_bytes<uint8_t>((void*)data_en, (size_t)3, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
    }

    else
    {
        uint8_t data_en[4];
        read_bytes<uint8_t>((void*)data_en, (size_t)4, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
        model.has_range_penalty = (bool)data_en[3];
    }

    if (lacks_scoring_metric)
    {
        model.scoring_metric = Depth;
    }

    else
    {
        uint8_t data_en;
        read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
        model.scoring_metric = (ScoringMetric)data_en;
    }

    double data_doubles[2];
    read_bytes<double, double>((void*)data_doubles, (size_t)2, in, buffer, diff_endian);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)2, in, buffer, diff_endian);
    model.orig_sample_size = data_sizets[0];
    model.hplanes.resize(data_sizets[1]);
    model.hplanes.shrink_to_fit();

    size_t veclen;
    std::vector<uint8_t> buffer_;
    for (auto &tree : model.hplanes) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer_, buffer, diff_endian);
    }
}